

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttobjs.c
# Opt level: O0

FT_Error tt_size_init_bytecode(FT_Size ftsize,FT_Bool pedantic)

{
  FT_Face pFVar1;
  FT_Memory memory_00;
  FT_UShort maxPoints;
  FT_Error FVar2;
  TT_ExecContext pTVar3;
  FT_Size_Internal pFVar4;
  FT_Pointer pvVar5;
  FT_Face pFVar6;
  FT_Generic_Finalizer p_Var7;
  FT_Library library;
  TT_Size_Metrics *tt_metrics;
  TT_MaxProfile *maxp;
  FT_UShort n_twilight;
  FT_Memory memory;
  TT_Face face;
  TT_Size size;
  FT_Error error;
  FT_Bool pedantic_local;
  FT_Size ftsize_local;
  
  pFVar1 = ftsize->face;
  memory_00 = pFVar1->memory;
  size._7_1_ = pedantic;
  _error = ftsize;
  ft_mem_free(memory_00,ftsize[2].internal);
  ftsize[2].internal = (FT_Size_Internal)0x0;
  ft_mem_free(memory_00,ftsize[3].generic.data);
  ftsize[3].generic.data = (void *)0x0;
  ft_mem_free(memory_00,ftsize[5].face);
  ftsize[5].face = (FT_Face)0x0;
  ft_mem_free(memory_00,ftsize[5].generic.finalizer);
  ftsize[5].generic.finalizer = (FT_Generic_Finalizer)0x0;
  if (ftsize[6].face != (FT_Face)0x0) {
    TT_Done_Context((TT_ExecContext)ftsize[6].face);
  }
  tt_glyphzone_done((TT_GlyphZone)&ftsize[5].metrics);
  *(undefined4 *)&ftsize[6].generic.data = 0xffffffff;
  *(undefined4 *)((long)&ftsize[6].generic.data + 4) = 0xffffffff;
  pTVar3 = TT_New_Context((TT_Driver)pFVar1->driver);
  ftsize[6].face = (FT_Face)pTVar3;
  *(uint *)((long)&ftsize[2].metrics.max_advance + 4) = (uint)*(ushort *)&pFVar1[1].extensions;
  *(uint *)((long)&ftsize[3].face + 4) = (uint)*(ushort *)((long)&pFVar1[1].extensions + 2);
  *(undefined4 *)&ftsize[2].metrics.max_advance = 0;
  *(undefined4 *)&ftsize[3].face = 0;
  *(undefined4 *)&ftsize[3].generic.finalizer = 0;
  *(undefined4 *)((long)&ftsize[3].generic.finalizer + 4) = 0;
  ftsize[4].internal = (FT_Size_Internal)pFVar1[4].generic.data;
  *(undefined2 *)&ftsize[5].generic.data = *(undefined2 *)((long)&pFVar1[1].autohint.finalizer + 6);
  *(undefined1 *)((long)&ftsize[2].metrics.ascender + 1) = 0;
  *(undefined1 *)((long)&ftsize[2].metrics.ascender + 2) = 0;
  ftsize[2].generic.finalizer = (FT_Generic_Finalizer)0x0;
  ftsize[2].metrics.x_ppem = 0;
  ftsize[2].metrics.y_ppem = 0;
  *(undefined4 *)&ftsize[2].metrics.field_0x4 = 0;
  ftsize[2].metrics.x_scale = 0;
  ftsize[2].metrics.y_scale = 0;
  pFVar4 = (FT_Size_Internal)
           ft_mem_realloc(memory_00,0x28,0,
                          (ulong)*(uint *)((long)&ftsize[2].metrics.max_advance + 4),(void *)0x0,
                          (FT_Error *)&size);
  ftsize[2].internal = pFVar4;
  if ((FT_Error)size == 0) {
    pvVar5 = ft_mem_realloc(memory_00,0x28,0,(ulong)*(uint *)((long)&ftsize[3].face + 4),(void *)0x0
                            ,(FT_Error *)&size);
    ftsize[3].generic.data = pvVar5;
    if ((FT_Error)size == 0) {
      pFVar6 = (FT_Face)ft_mem_realloc(memory_00,8,0,(FT_Long)ftsize[4].internal,(void *)0x0,
                                       (FT_Error *)&size);
      ftsize[5].face = pFVar6;
      if ((FT_Error)size == 0) {
        p_Var7 = (FT_Generic_Finalizer)
                 ft_mem_realloc(memory_00,8,0,(ulong)*(ushort *)&ftsize[5].generic.data,(void *)0x0,
                                (FT_Error *)&size);
        ftsize[5].generic.finalizer = p_Var7;
        if ((FT_Error)size == 0) {
          maxPoints = *(short *)((long)&pFVar1[1].autohint.finalizer + 4) + 4;
          size._0_4_ = tt_glyphzone_new(memory_00,maxPoints,0,(TT_GlyphZone)&ftsize[5].metrics);
          if ((FT_Error)size == 0) {
            *(FT_UShort *)((long)&ftsize[5].metrics.x_scale + 4) = maxPoints;
            memcpy(&ftsize[3].metrics.max_advance,&tt_default_graphics_state,0x60);
            pFVar1[4].bbox.xMin = (FT_Pos)((pFVar1->driver->root).library)->debug_hooks[0];
            if (pFVar1[4].bbox.xMin == 0) {
              pFVar1[4].bbox.xMin = (FT_Pos)TT_RunIns;
            }
            FVar2 = tt_size_run_fpgm((TT_Size)ftsize,size._7_1_);
            return FVar2;
          }
        }
      }
    }
  }
  if ((FT_Error)size != 0) {
    tt_size_done_bytecode(_error);
  }
  return (FT_Error)size;
}

Assistant:

static FT_Error
  tt_size_init_bytecode( FT_Size  ftsize,
                         FT_Bool  pedantic )
  {
    FT_Error   error;
    TT_Size    size = (TT_Size)ftsize;
    TT_Face    face = (TT_Face)ftsize->face;
    FT_Memory  memory = face->root.memory;

    FT_UShort       n_twilight;
    TT_MaxProfile*  maxp = &face->max_profile;


    /* clean up bytecode related data */
    FT_FREE( size->function_defs );
    FT_FREE( size->instruction_defs );
    FT_FREE( size->cvt );
    FT_FREE( size->storage );

    if ( size->context )
      TT_Done_Context( size->context );
    tt_glyphzone_done( &size->twilight );

    size->bytecode_ready = -1;
    size->cvt_ready      = -1;

    size->context = TT_New_Context( (TT_Driver)face->root.driver );

    size->max_function_defs    = maxp->maxFunctionDefs;
    size->max_instruction_defs = maxp->maxInstructionDefs;

    size->num_function_defs    = 0;
    size->num_instruction_defs = 0;

    size->max_func = 0;
    size->max_ins  = 0;

    size->cvt_size     = face->cvt_size;
    size->storage_size = maxp->maxStorage;

    /* Set default metrics */
    {
      TT_Size_Metrics*  tt_metrics = &size->ttmetrics;


      tt_metrics->rotated   = FALSE;
      tt_metrics->stretched = FALSE;

      /* set default engine compensation */
      tt_metrics->compensations[0] = 0;   /* gray     */
      tt_metrics->compensations[1] = 0;   /* black    */
      tt_metrics->compensations[2] = 0;   /* white    */
      tt_metrics->compensations[3] = 0;   /* reserved */
    }

    /* allocate function defs, instruction defs, cvt, and storage area */
    if ( FT_NEW_ARRAY( size->function_defs,    size->max_function_defs    ) ||
         FT_NEW_ARRAY( size->instruction_defs, size->max_instruction_defs ) ||
         FT_NEW_ARRAY( size->cvt,              size->cvt_size             ) ||
         FT_NEW_ARRAY( size->storage,          size->storage_size         ) )
      goto Exit;

    /* reserve twilight zone */
    n_twilight = maxp->maxTwilightPoints;

    /* there are 4 phantom points (do we need this?) */
    n_twilight += 4;

    error = tt_glyphzone_new( memory, n_twilight, 0, &size->twilight );
    if ( error )
      goto Exit;

    size->twilight.n_points = n_twilight;

    size->GS = tt_default_graphics_state;

    /* set `face->interpreter' according to the debug hook present */
    {
      FT_Library  library = face->root.driver->root.library;


      face->interpreter = (TT_Interpreter)
                            library->debug_hooks[FT_DEBUG_HOOK_TRUETYPE];
      if ( !face->interpreter )
        face->interpreter = (TT_Interpreter)TT_RunIns;
    }

    /* Fine, now run the font program! */

    /* In case of an error while executing `fpgm', we intentionally don't */
    /* clean up immediately – bugs in the `fpgm' are so fundamental that  */
    /* all following hinting calls should fail.  Additionally, `fpgm' is  */
    /* to be executed just once; calling it again is completely useless   */
    /* and might even lead to extremely slow behaviour if it is malformed */
    /* (containing an infinite loop, for example).                        */
    error = tt_size_run_fpgm( size, pedantic );
    return error;

  Exit:
    if ( error )
      tt_size_done_bytecode( ftsize );

    return error;
  }